

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

void __thiscall
Js::ScriptFunction::ChangeEntryPoint
          (ScriptFunction *this,ProxyEntryPointInfo *entryPointInfo,JavascriptMethod entryPoint)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  int iVar4;
  undefined4 *puVar5;
  FunctionProxy *pFVar6;
  FunctionBody *this_00;
  ScriptFunctionType *this_01;
  bool local_31;
  bool isAsmJS;
  JavascriptMethod entryPoint_local;
  ProxyEntryPointInfo *entryPointInfo_local;
  ScriptFunction *this_local;
  
  TVar3 = RecyclableObject::GetTypeId((RecyclableObject *)this);
  if (TVar3 != TypeIds_Function) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0xfa,"(this->GetTypeId() == TypeIds_Function)",
                                "this->GetTypeId() == TypeIds_Function");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  iVar4 = (*(this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x66])();
  if ((iVar4 != 0) && (entryPoint == checkCodeGenThunk)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0xfc,
                                "(!IsCrossSiteObject() || entryPoint != (Js::JavascriptMethod)checkCodeGenThunk)"
                                ,
                                "!IsCrossSiteObject() || entryPoint != (Js::JavascriptMethod)checkCodeGenThunk"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((entryPointInfo == (ProxyEntryPointInfo *)0x0) ||
     (pFVar6 = GetFunctionProxy(this), pFVar6 == (FunctionProxy *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0xff,
                                "((entryPointInfo != nullptr && this->GetFunctionProxy() != nullptr))"
                                ,
                                "(entryPointInfo != nullptr && this->GetFunctionProxy() != nullptr)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = HasFunctionBody(this);
  local_31 = false;
  if (bVar2) {
    this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)this);
    local_31 = ParseableFunctionInfo::GetIsAsmjsMode(&this_00->super_ParseableFunctionInfo);
  }
  this_01 = GetScriptFunctionType(this);
  ScriptFunctionType::ChangeEntryPoint(this_01,entryPointInfo,entryPoint,local_31);
  return;
}

Assistant:

void ScriptFunction::ChangeEntryPoint(ProxyEntryPointInfo* entryPointInfo, JavascriptMethod entryPoint)
    {
        Assert(this->GetTypeId() == TypeIds_Function);
#if ENABLE_NATIVE_CODEGEN
        Assert(!IsCrossSiteObject() || entryPoint != (Js::JavascriptMethod)checkCodeGenThunk);
#endif

        Assert((entryPointInfo != nullptr && this->GetFunctionProxy() != nullptr));

        bool isAsmJS = HasFunctionBody() && this->GetFunctionBody()->GetIsAsmjsMode();
        this->GetScriptFunctionType()->ChangeEntryPoint(entryPointInfo, entryPoint, isAsmJS);
    }